

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::ParsePublicKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context_conflict *aPublicKey,
          ByteArray *aCert)

{
  bool bVar1;
  uchar *buf;
  size_type buflen;
  string *aErrorMessage;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  Error local_480;
  Error local_458;
  int local_430;
  anon_class_1_0_00000001 local_42a;
  v10 local_429;
  int fail;
  size_t local_420;
  string local_418;
  Error local_3f8;
  undefined1 local_3c0 [8];
  mbedtls_x509_crt_conflict cert;
  ByteArray *aCert_local;
  mbedtls_pk_context_conflict *aPublicKey_local;
  TokenManager *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  int *local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  cert.next._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  mbedtls_x509_crt_init((mbedtls_x509_crt *)local_3c0);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aCert);
  if (bVar1) {
    ParsePublicKey::anon_class_1_0_00000001::operator()(&local_42a);
    local_58 = &fail;
    local_60 = &local_429;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_420 = bVar2.size_;
    _fail = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_418;
    local_78 = _fail;
    sStack_70 = local_420;
    local_50 = &local_78;
    local_88 = _fail;
    local_80 = local_420;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_418,local_88,fmt,args);
    Error::Error(&local_3f8,kInvalidArgs,&local_418);
    Error::operator=(__return_storage_ptr__,&local_3f8);
    Error::~Error(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
  }
  else {
    buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aCert);
    buflen = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aCert);
    local_430 = mbedtls_x509_crt_parse((mbedtls_x509_crt *)local_3c0,buf,buflen);
    if (local_430 == 0) {
      MoveMbedtlsKey(aPublicKey,(mbedtls_pk_context_conflict *)&cert.pk_raw.p);
    }
    else {
      ErrorFromMbedtlsError(&local_458,local_430);
      Error::operator=(__return_storage_ptr__,&local_458);
      Error::~Error(&local_458);
      aErrorMessage = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
      Error::Error(&local_480,kInvalidArgs,aErrorMessage);
      Error::operator=(__return_storage_ptr__,&local_480);
      Error::~Error(&local_480);
    }
  }
  mbedtls_x509_crt_free((mbedtls_x509_crt *)local_3c0);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePublicKey(mbedtls_pk_context &aPublicKey, const ByteArray &aCert)
{
    Error            error;
    mbedtls_x509_crt cert;

    mbedtls_x509_crt_init(&cert);

    VerifyOrExit(!aCert.empty(), error = ERROR_INVALID_ARGS("the raw certificate is empty"));
    if (int fail = mbedtls_x509_crt_parse(&cert, aCert.data(), aCert.size()))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

    // Steal the public key from the 'cert' object.
    MoveMbedtlsKey(aPublicKey, cert.pk);

exit:
    mbedtls_x509_crt_free(&cert);

    return error;
}